

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# char.h
# Opt level: O3

char __thiscall kj::parse::_::InterpretEscape::operator()(InterpretEscape *this,char c)

{
  undefined3 in_register_00000031;
  int iVar1;
  
  iVar1 = CONCAT31(in_register_00000031,c);
  if (iVar1 < 0x6e) {
    if (iVar1 == 0x61) {
      return '\a';
    }
    if (iVar1 == 0x62) {
      return '\b';
    }
    if (iVar1 == 0x66) {
      return '\f';
    }
  }
  else {
    switch(iVar1) {
    case 0x6e:
      iVar1 = 10;
      break;
    case 0x72:
      return '\r';
    case 0x74:
      return '\t';
    case 0x76:
      return '\v';
    }
  }
  return (char)iVar1;
}

Assistant:

char operator()(char c) const {
    switch (c) {
      case 'a': return '\a';
      case 'b': return '\b';
      case 'f': return '\f';
      case 'n': return '\n';
      case 'r': return '\r';
      case 't': return '\t';
      case 'v': return '\v';
      default: return c;
    }
  }